

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O2

bool __thiscall gui::ChatBox::handleKeyPressed(ChatBox *this,KeyEvent *key)

{
  Key KVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  reference left;
  size_t sVar5;
  ulong uVar6;
  int delta;
  ulong __n;
  locale local_b8 [8];
  String selectedText;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_90
  ;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_50
  ;
  
  bVar3 = Widget::handleKeyPressed(&this->super_Widget,key);
  if (this->autoHide_ != false) {
    return bVar3;
  }
  KVar1 = key->code;
  if (key->control == true) {
    if ((KVar1 != X) && (KVar1 != C)) {
      if (KVar1 != A) {
        return bVar3;
      }
      sVar4 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
      if (sVar4 == 0) {
        return true;
      }
      updateSelection(this,0,false);
      sVar4 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
      updateSelection(this,sVar4 - 1,true);
      return true;
    }
    if ((this->selectionStart_).second != true) {
      return true;
    }
    sf::String::String(&selectedText);
    __n = (this->selectionStart_).first;
    uVar2 = this->selectionEnd_;
    uVar6 = uVar2;
    if (uVar2 < __n) {
      uVar6 = __n;
      __n = uVar2;
    }
    for (; __n <= uVar6; __n = __n + 1) {
      left = std::_Deque_iterator<gui::ChatBoxLine,_gui::ChatBoxLine_&,_gui::ChatBoxLine_*>::
             operator[](&(this->lines_).
                         super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
                         _M_impl.super__Deque_impl_data._M_start,__n);
      std::locale::locale(local_b8);
      sf::String::String((String *)&local_90,"\n",local_b8);
      sf::operator+((String *)&local_70,&left->str,(String *)&local_90);
      sf::operator+((String *)&local_50,(String *)&local_70,&selectedText);
      sf::String::operator=(&selectedText,(String *)&local_50);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string(&local_50);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string(&local_70);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string(&local_90);
      std::locale::~locale(local_b8);
    }
    sf::Clipboard::setString(&selectedText);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&selectedText.m_string);
    goto LAB_00130a7d;
  }
  switch(KVar1) {
  case PageUp:
    delta = (int)(this->sizeCharacters_).y + -1;
    break;
  case PageDown:
    delta = 1 - (int)(this->sizeCharacters_).y;
    break;
  case End:
    sVar4 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
    if (sVar4 == 0) {
      sVar5 = 0;
    }
    else {
      sVar4 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size(&this->lines_);
      sVar5 = sVar4 - 1;
    }
    this->verticalScroll_ = sVar5;
    goto LAB_00130a73;
  case Home:
    this->verticalScroll_ = 0;
LAB_00130a73:
    updateVisibleLines(this,false);
    goto LAB_00130a7d;
  default:
    goto switchD_00130915_caseD_41;
  case Up:
    delta = 1;
    break;
  case Down:
    delta = -1;
  }
  updateScroll(this,delta);
LAB_00130a7d:
  bVar3 = true;
switchD_00130915_caseD_41:
  return bVar3;
}

Assistant:

bool ChatBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (autoHide_) {
        return eventConsumed;
    }

    if (key.control) {
        if (key.code == sf::Keyboard::A) {
            if (lines_.size() > 0) {
                updateSelection(0, false);
                updateSelection(lines_.size() - 1, true);
            }
        } else if (key.code == sf::Keyboard::X || key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::String selectedText;
                size_t selectionMin = std::min(selectionStart_.first, selectionEnd_);
                size_t selectionMax = std::max(selectionStart_.first, selectionEnd_);
                for (size_t i = selectionMin; i <= selectionMax; ++i) {
                    selectedText = lines_[i].str + "\n" + selectedText;
                }
                sf::Clipboard::setString(selectedText);
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::PageUp) {
        updateScroll(static_cast<int>(sizeCharacters_.y) - 1);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateScroll(-static_cast<int>(sizeCharacters_.y) + 1);
    } else if (key.code == sf::Keyboard::Home) {
        verticalScroll_ = 0;
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::End) {
        verticalScroll_ = (lines_.size() > 0 ? lines_.size() - 1 : 0);
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::Up) {
        updateScroll(1);
    } else if (key.code == sf::Keyboard::Down) {
        updateScroll(-1);
    } else {
        return eventConsumed;
    }
    return true;
}